

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O1

void __thiscall
ExtPubkey_CreateExtPubkeyFromPubkey_Test::TestBody(ExtPubkey_CreateExtPubkeyFromPubkey_Test *this)

{
  long *plVar1;
  pointer puVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  char *pcVar7;
  char *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  ExtPubkey extkey;
  AssertHelper local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  undefined1 local_158 [16];
  AssertHelper local_148;
  _Alloc_hider local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [40];
  pointer local_100;
  pointer puStack_f8;
  pointer puStack_f0;
  pointer local_e8;
  pointer puStack_e0;
  pointer puStack_d8;
  pointer local_d0;
  pointer puStack_c8;
  pointer puStack_c0;
  Pubkey local_b8;
  ExtPubkey local_a0;
  ByteData256 local_30;
  
  cfd::core::ExtPubkey::ExtPubkey(&local_a0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_168.data_ = (AssertHelperData *)local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,
                 "02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3","");
      cfd::core::Pubkey::Pubkey(&local_b8,(string *)&local_168);
      local_148.data_ = (AssertHelperData *)local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 "87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5","");
      cfd::core::ByteData256::ByteData256(&local_30,(string *)&local_148);
      in_R9 = &DAT_0000002c;
      cfd::core::ExtPubkey::ExtPubkey
                ((ExtPubkey *)local_128,kTestnet,&local_b8,&local_30,'\x03',0x2c);
      puVar2 = local_a0.serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
      local_a0.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
      local_a0.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
      local_128._0_8_ = (long *)0x0;
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x0;
      if ((long *)puVar2 != (long *)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_a0.chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.version_ = local_128._24_4_;
      local_a0.fingerprint_ = local_128._28_4_;
      local_a0.depth_ = local_128[0x20];
      local_a0._33_3_ = local_128._33_3_;
      local_a0.child_num_ = local_128._36_4_;
      local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_100;
      local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_f8;
      local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_f0;
      local_100 = (pointer)0x0;
      puStack_f8 = (pointer)0x0;
      puStack_f0 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_a0.pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = local_e8;
      local_a0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = puStack_e0;
      local_a0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_d8;
      local_e8 = (pointer)0x0;
      puStack_e0 = (pointer)0x0;
      puStack_d8 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_a0.tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_d0;
      local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_c8;
      local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_c0;
      local_d0 = (pointer)0x0;
      puStack_c8 = (pointer)0x0;
      puStack_c0 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      if (local_d0 != (pointer)0x0) {
        operator_delete(local_d0);
      }
      if (local_e8 != (pointer)0x0) {
        operator_delete(local_e8);
      }
      if (local_100 != (pointer)0x0) {
        operator_delete(local_100);
      }
      if ((long *)local_128._0_8_ != (long *)0x0) {
        operator_delete((void *)local_128._0_8_);
      }
      if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_30.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.data_ != (AssertHelperData *)local_138) {
        operator_delete(local_148.data_);
      }
      if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_168.data_ != (AssertHelperData *)local_158) {
        operator_delete(local_168.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xc5,
               "Expected: (extkey = ExtPubkey(NetType::kTestnet, Pubkey(\"02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3\"), ByteData256(\"87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5\"), 3, 44)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  cfd::core::ExtPubkey::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_148,
             "\"043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\""
             ,"extkey.GetData().GetHex().c_str()",
             "043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3"
             ,(char *)local_128._0_8_);
  plVar1 = (long *)(local_128 + 0x10);
  if ((long *)local_128._0_8_ != plVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_168.data_);
  }
  if (local_148.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_140._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_140._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xc6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ExtPubkey::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_168,
             "\"tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"extkey.ToString().c_str()",
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,(char *)local_128._0_8_);
  if ((long *)local_128._0_8_ != plVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_160.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,199,pcVar7);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ExtPubkey::GetVersionData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_148,"\"043587cf\"","extkey.GetVersionData().GetHex().c_str()",
             "043587cf",(char *)local_128._0_8_);
  if ((long *)local_128._0_8_ != plVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_168.data_);
  }
  if (local_148.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_140._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_140._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,200,pcVar7);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar6 = cfd::core::ExtPubkey::GetVersion();
  local_168.data_._0_4_ = uVar6;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_128,"extpubkey_kVersionTestnetPubkey","extkey.GetVersion()",
             &extpubkey_kVersionTestnetPubkey,(uint *)&local_168);
  if (local_128[0] == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((pointer)local_128._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xc9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_168.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_168.data_ + 8))();
      }
      local_168.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_128 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar4 = cfd::core::ExtPubkey::IsValid();
  local_168.data_._0_1_ = (string)cVar4;
  local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_168,(AssertionResult *)"extkey.IsValid()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xca,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_128._0_8_ != plVar1) {
      operator_delete((void *)local_128._0_8_);
    }
    if (local_148.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_148.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_148.data_ + 8))();
      }
      local_148.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168.data_._0_4_ = 4;
  uVar5 = cfd::core::ExtPubkey::GetDepth();
  local_148.data_._0_1_ = (string)uVar5;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)local_128,"4","extkey.GetDepth()",(int *)&local_168,(uchar *)&local_148);
  if (local_128[0] == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((pointer)local_128._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcb,pcVar7);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_168.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_168.data_ + 8))();
      }
      local_168.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_128 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_148,
             "\"03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\"",
             "extkey.GetPubkey().GetHex().c_str()",
             "03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",
             (char *)local_128._0_8_);
  if ((long *)local_128._0_8_ != plVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_168.data_);
  }
  if (local_148.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_140._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_140._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ExtPubkey::GetChainCode();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_148,
             "\"839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e\"",
             "extkey.GetChainCode().GetHex().c_str()",
             "839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e",
             (char *)local_128._0_8_);
  if ((long *)local_128._0_8_ != plVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_168.data_);
  }
  if (local_148.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_140._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_140._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xcd,pcVar7);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ExtPubkey::GetFingerprintData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_148,"\"a53a8ff3\"","extkey.GetFingerprintData().GetHex().c_str()",
             "a53a8ff3",(char *)local_128._0_8_);
  if ((long *)local_128._0_8_ != plVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_168.data_);
  }
  if (local_148.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_140._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_140._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_extpubkey.cpp"
               ,0xce,pcVar7);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_128._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_128._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((long *)local_a0.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_a0.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ExtPubkey, CreateExtPubkeyFromPubkey) {
  ExtPubkey extkey;

  EXPECT_NO_THROW((extkey = ExtPubkey(NetType::kTestnet,
      Pubkey("02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3"),
      ByteData256("87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5"),
      3, 44)));
  EXPECT_STREQ("043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", extkey.ToString().c_str());
  EXPECT_STREQ("043587cf", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, extkey.GetVersion());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_EQ(4, extkey.GetDepth());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", extkey.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", extkey.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("a53a8ff3", extkey.GetFingerprintData().GetHex().c_str());
}